

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linear_Object_State_PDU.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Linear_Object_State_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Linear_Object_State_PDU *this)

{
  pointer pLVar1;
  ostream *poVar2;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  pointer pLVar3;
  KStringStream ss;
  KString local_298;
  KString local_278;
  KString local_258;
  KString local_238;
  KString local_218;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_298,(Header7 *)this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"-Linear Object State PDU-\n",0x1a);
  Object_State_Header::GetAsString_abi_cxx11_(&local_218,&this->super_Object_State_Header);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_218._M_dataplus._M_p,local_218._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Number Of Segments: ",0x14);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Requestor ID:\n",0xe);
  DATA_TYPE::SimulationIdentifier::GetAsString_abi_cxx11_(&local_1d8,&this->m_ReqID);
  UTILS::IndentString(&local_238,&local_1d8,Tabs,in_CL);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_238._M_dataplus._M_p,local_238._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Receiving ID:\n",0xe);
  DATA_TYPE::SimulationIdentifier::GetAsString_abi_cxx11_(&local_1f8,&this->m_RecvID);
  UTILS::IndentString(&local_258,&local_1f8,Tabs_00,in_CL);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_258._M_dataplus._M_p,local_258._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Object Type:  ",0xe);
  DATA_TYPE::ObjectType::GetAsString_abi_cxx11_(&local_278,&this->m_ObjTyp);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,local_278._M_dataplus._M_p,local_278._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  pLVar1 = (this->m_vSegments).
           super__Vector_base<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pLVar3 = (this->m_vSegments).
                super__Vector_base<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
                ._M_impl.super__Vector_impl_data._M_start; pLVar3 != pLVar1; pLVar3 = pLVar3 + 1) {
    (*(pLVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_298,pLVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

KString Linear_Object_State_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Linear Object State PDU-\n"
       << Object_State_Header::GetAsString()
       << "Number Of Segments: " << ( KUINT16 )m_ui8NumSegment
       << "Requestor ID:\n"  << IndentString( m_ReqID.GetAsString(), 1 )
       << "Receiving ID:\n"  << IndentString( m_RecvID.GetAsString(), 1 )
       << "Object Type:  "   << m_ObjTyp.GetAsString();

    vector<LinearSegmentParameter>::const_iterator citr = m_vSegments.begin();
    std::vector<LinearSegmentParameter>::const_iterator citrEnd = m_vSegments.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << citr->GetAsString();
    }

    return ss.str();
}